

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  size_type sVar1;
  pointer pcVar2;
  cmSourceFile *this_00;
  cmake *this_01;
  undefined8 uVar3;
  _Alloc_hider this_02;
  iterator iVar4;
  uint uVar5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  string *psVar9;
  cmCustomCommand *pcVar10;
  long *plVar11;
  ostream *poVar12;
  cmSourceFileLocation *pcVar13;
  element_type *peVar14;
  cmSourceFile **ppcVar15;
  uint uVar16;
  undefined8 sourceName;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar17;
  string xaml;
  cmSourceFile *sf;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  string hFileName;
  string cppFileName;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  srcs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  string ext;
  RegularExpression header_regex;
  undefined1 local_370 [32];
  _Alloc_hider local_350;
  cmSourceFile **local_348;
  iterator iStack_340;
  cmSourceFile **local_338;
  undefined1 local_328 [16];
  undefined1 local_318 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0 [2];
  element_type *local_2d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  undefined1 local_2a8 [8];
  _Rb_tree_node_base local_2a0;
  _Base_ptr local_280;
  undefined1 local_278 [16];
  _Rb_tree_node_base local_268 [3];
  ios_base local_208 [264];
  RegularExpression local_100;
  
  local_2f0[1]._0_8_ = files;
  GetSourceFilePaths((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_2c0,this,config);
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  local_348 = (cmSourceFile **)0x0;
  iStack_340._M_current = (cmSourceFile **)0x0;
  local_338 = (cmSourceFile **)0x0;
  local_2a0._M_left = &local_2a0;
  local_2a0._M_color = _S_red;
  local_2a0._M_parent = (_Base_ptr)0x0;
  local_280 = (_Base_ptr)0x0;
  local_318._16_8_ = local_2c0._8_8_;
  local_2a0._M_right = local_2a0._M_left;
  if (local_2c0._M_allocated_capacity != local_2c0._8_8_) {
    local_2d0 = (element_type *)(local_2f0[1]._0_8_ + 0x48);
    local_2f0[1]._8_8_ = local_2f0[1]._0_8_ + 0x78;
    local_2c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2f0[1]._0_8_ + 0x18);
    sourceName = local_2c0._M_allocated_capacity;
    do {
      local_350._M_p =
           (pointer)cmMakefile::GetOrCreateSource
                              (this->Makefile,(string *)sourceName,false,Ambiguous);
      pVar17 = std::
               _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
               ::_M_insert_unique<cmSourceFile*const&>
                         ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                           *)local_2a8,(cmSourceFile **)&local_350);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar9 = cmSourceFile::GetExtension_abi_cxx11_((cmSourceFile *)local_350._M_p);
        cmsys::SystemTools::LowerCase((string *)local_278,psVar9);
        pcVar10 = cmSourceFile::GetCustomCommand((cmSourceFile *)local_350._M_p);
        uVar16 = 2;
        if (pcVar10 == (cmCustomCommand *)0x0) {
          TVar7 = cmTarget::GetType(this->Target);
          this_02._M_p = local_350._M_p;
          uVar16 = 4;
          if (TVar7 != UTILITY) {
            local_370._0_8_ = local_370 + 0x10;
            local_328._0_8_ = (element_type *)0x10;
            local_370._0_8_ = std::__cxx11::string::_M_create((ulong *)local_370,(ulong)local_328);
            local_370._16_7_ = (undefined7)local_328._0_8_;
            local_370[0x17] = SUB81(local_328._0_8_,7);
            builtin_strncpy((char *)local_370._0_8_,"HEADER_FILE_ONLY",0x10);
            local_370._8_8_ = local_328._0_8_;
            *(char *)(local_370._0_8_ + local_328._0_8_) = '\0';
            bVar6 = cmSourceFile::GetPropertyAsBool
                              ((cmSourceFile *)this_02._M_p,(string *)local_370);
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_,CONCAT17(local_370[0x17],local_370._16_7_) + 1
                             );
            }
            uVar16 = 5;
            if (!bVar6) {
              local_370._24_4_ = 0x4a424f5f;
              local_370._28_3_ = 0x544345;
              local_370._16_7_ = 0x414e5245545845;
              local_370[0x17] = 'L';
              local_370._8_8_ = (element_type *)0xf;
              local_370[0x1f] = '\0';
              local_370._0_8_ = local_370 + 0x10;
              bVar6 = cmSourceFile::GetPropertyAsBool
                                ((cmSourceFile *)local_350._M_p,(string *)local_370);
              if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                operator_delete((void *)local_370._0_8_,
                                CONCAT17(local_370[0x17],local_370._16_7_) + 1);
              }
              uVar16 = 3;
              if (!bVar6) {
                cmSourceFile::GetLanguage_abi_cxx11_
                          ((string *)local_370,(cmSourceFile *)local_350._M_p);
                uVar3 = local_370._8_8_;
                if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                  operator_delete((void *)local_370._0_8_,
                                  CONCAT17(local_370[0x17],local_370._16_7_) + 1);
                }
                uVar16 = 9;
                if ((element_type *)uVar3 == (element_type *)0x0) {
                  iVar8 = std::__cxx11::string::compare(local_278);
                  if (iVar8 == 0) {
                    TVar7 = cmTarget::GetType(this->Target);
                    uVar16 = 8;
                    if (TVar7 == OBJECT_LIBRARY) {
                      uVar5 = 8;
                      if (iStack_340._M_current == local_338) {
                        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                        _M_realloc_insert<cmSourceFile*const&>
                                  ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&local_348
                                   ,iStack_340,(cmSourceFile **)&local_350);
                      }
                      else {
LAB_003a1fd3:
                        uVar16 = uVar5;
                        *iStack_340._M_current = (cmSourceFile *)local_350._M_p;
                        iStack_340._M_current = iStack_340._M_current + 1;
                      }
                    }
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare(local_278);
                    if (iVar8 == 0) {
                      TVar7 = cmTarget::GetType(this->Target);
                      uVar16 = 6;
                      if (TVar7 == OBJECT_LIBRARY) {
                        uVar5 = 6;
                        if (iStack_340._M_current != local_338) goto LAB_003a1fd3;
                        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                        _M_realloc_insert<cmSourceFile*const&>
                                  ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&local_348
                                   ,iStack_340,(cmSourceFile **)&local_350);
                      }
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare(local_278);
                      if (iVar8 == 0) {
                        psVar9 = cmSourceFile::GetFullPath
                                           ((cmSourceFile *)local_350._M_p,(string *)0x0);
                        local_370._0_8_ = local_370 + 0x10;
                        pcVar2 = (psVar9->_M_dataplus)._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_370,pcVar2,pcVar2 + psVar9->_M_string_length);
                        std::__cxx11::string::rfind((char)(string *)local_370,0x2e);
                        std::__cxx11::string::substr((ulong)(local_318 + 0x18),(ulong)local_370);
                        plVar11 = (long *)std::__cxx11::string::append(local_318 + 0x18);
                        peVar14 = (element_type *)(plVar11 + 2);
                        if ((element_type *)*plVar11 == peVar14) {
                          local_318._0_8_ = (peVar14->field_0).Bottom.State;
                          local_318._8_8_ = plVar11[3];
                          local_328._0_8_ = (element_type *)local_318;
                        }
                        else {
                          local_318._0_8_ = (peVar14->field_0).Bottom.State;
                          local_328._0_8_ = (element_type *)*plVar11;
                        }
                        local_328._8_8_ = plVar11[1];
                        *plVar11 = (long)peVar14;
                        plVar11[1] = 0;
                        *(undefined1 *)(plVar11 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_318._24_8_ != local_2f0) {
                          operator_delete((void *)local_318._24_8_,local_2f0[0]._0_8_ + 1);
                        }
                        std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)local_2c8._M_pi,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_328);
                        if ((element_type *)local_328._0_8_ != (element_type *)local_318) {
                          operator_delete((void *)local_328._0_8_,
                                          (ulong)&(((
                                                  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                                  *)local_318._0_8_)->_M_t)._M_impl.field_0x1);
                        }
                        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                          operator_delete((void *)local_370._0_8_,
                                          CONCAT17(local_370[0x17],local_370._16_7_) + 1);
                        }
                        uVar16 = 10;
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare(local_278);
                        if (iVar8 == 0) {
                          uVar16 = 0;
                        }
                        else {
                          iVar8 = std::__cxx11::string::compare(local_278);
                          if (iVar8 == 0) {
                            uVar16 = 7;
                          }
                          else {
                            iVar8 = std::__cxx11::string::compare(local_278);
                            if (iVar8 == 0) {
                              uVar16 = 1;
                            }
                            else {
                              iVar8 = std::__cxx11::string::compare(local_278);
                              if (iVar8 == 0) {
                                psVar9 = cmSourceFile::GetFullPath
                                                   ((cmSourceFile *)local_350._M_p,(string *)0x0);
                                local_370._0_8_ = local_370 + 0x10;
                                pcVar2 = (psVar9->_M_dataplus)._M_p;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)local_370,pcVar2,
                                           pcVar2 + psVar9->_M_string_length);
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_328,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_370,".h");
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)(local_318 + 0x18),
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_370,".cpp");
                                std::
                                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                ::_M_insert_unique<std::__cxx11::string_const&>
                                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                            *)local_2d0,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_328);
                                std::
                                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                ::_M_insert_unique<std::__cxx11::string_const&>
                                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                            *)local_2f0[1]._8_8_,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(local_318 + 0x18));
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_318._24_8_ != local_2f0) {
                                  operator_delete((void *)local_318._24_8_,local_2f0[0]._0_8_ + 1);
                                }
                                if ((element_type *)local_328._0_8_ != (element_type *)local_318) {
                                  operator_delete((void *)local_328._0_8_,
                                                  (ulong)&(((
                                                  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                                  *)local_318._0_8_)->_M_t)._M_impl.field_0x1);
                                }
                                if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                                  operator_delete((void *)local_370._0_8_,
                                                  CONCAT17(local_370[0x17],local_370._16_7_) + 1);
                                }
                                uVar16 = 0xb;
                              }
                              else {
                                psVar9 = cmSourceFile::GetFullPath
                                                   ((cmSourceFile *)local_350._M_p,(string *)0x0);
                                bVar6 = cmsys::RegularExpression::find
                                                  (&local_100,(psVar9->_M_dataplus)._M_p,
                                                   &local_100.regmatch);
                                uVar16 = bVar6 | 4;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_370._8_8_ = (((cmGeneratorTarget *)sourceName)->ObjectDirectory)._M_dataplus._M_p;
        sVar1 = (((cmGeneratorTarget *)sourceName)->ObjectDirectory)._M_string_length;
        if (sVar1 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
          }
        }
        local_370._0_8_ = local_350._M_p;
        local_370._16_7_ = (undefined7)sVar1;
        local_370[0x17] = (undefined1)(sVar1 >> 0x38);
        local_370._24_4_ = uVar16;
        std::
        vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
        ::emplace_back<cmGeneratorTarget::SourceAndKind>
                  ((vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                    *)local_2f0[1]._0_8_,(SourceAndKind *)local_370);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT17(local_370[0x17],local_370._16_7_) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT17(local_370[0x17],local_370._16_7_));
        }
        if ((_Rb_tree_node_base *)local_278._0_8_ != local_268) {
          operator_delete((void *)local_278._0_8_,local_268[0]._0_8_ + 1);
        }
      }
      sourceName = &(((cmGeneratorTarget *)sourceName)->ObjectDirectory).field_2;
    } while (sourceName != local_318._16_8_);
  }
  if (local_348 != iStack_340._M_current) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"OBJECT library \"",0x10);
    psVar9 = cmTarget::GetName_abi_cxx11_(this->Target);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" contains:\n",0xc);
    iVar4._M_current = iStack_340._M_current;
    local_318._16_8_ = this;
    if (local_348 != iStack_340._M_current) {
      ppcVar15 = local_348;
      do {
        this_00 = *ppcVar15;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  ",2);
        pcVar13 = cmSourceFile::GetLocation(this_00);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(pcVar13->Name)._M_dataplus._M_p,
                             (pcVar13->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ppcVar15 = ppcVar15 + 1;
      } while (ppcVar15 != iVar4._M_current);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
               ,0x7b);
    this_01 = (*(cmGlobalGenerator **)(local_318._16_8_ + 0x18))->CMakeInstance;
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)local_328);
    cmake::IssueMessage(this_01,FATAL_ERROR,(string *)local_370,(cmListFileBacktrace *)local_328);
    if ((cmMakefile *)local_328._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
    }
    if ((cmSourceFile *)local_370._0_8_ != (cmSourceFile *)(local_370 + 0x10)) {
      operator_delete((void *)local_370._0_8_,CONCAT17(local_370[0x17],local_370._16_7_) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    std::ios_base::~ios_base(local_208);
  }
  std::
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  ::~_Rb_tree((_Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
               *)local_2a8);
  if (local_348 != (cmSourceFile **)0x0) {
    operator_delete(local_348,(long)local_338 - (long)local_348);
  }
  if ((_Base_ptr)local_100.program != (_Base_ptr)0x0) {
    operator_delete__(local_100.program);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_2c0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<BT<std::string>> srcs = this->GetSourceFilePaths(config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (BT<std::string> const& s : srcs) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(s.Value);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY) {
      kind = SourceKindExtra;
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
    } else if (!sf->GetLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
      // Build and save the name of the corresponding .h file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string resx = sf->GetFullPath();
      std::string hFileName = resx.substr(0, resx.find_last_of('.')) + ".h";
      files.ExpectedResxHeaders.insert(hFileName);
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      kind = SourceKindManifest;
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
      // Build and save the name of the corresponding .h and .cpp file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string xaml = sf->GetFullPath();
      std::string hFileName = xaml + ".h";
      std::string cppFileName = xaml + ".cpp";
      files.ExpectedXamlHeaders.insert(hFileName);
      files.ExpectedXamlSources.insert(cppFileName);
    } else if (header_regex.find(sf->GetFullPath())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    files.Sources.push_back({ BT<cmSourceFile*>(sf, s.Backtrace), kind });
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (cmSourceFile* i : badObjLib) {
      e << "  " << i->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}